

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

int __thiscall smf::MidiEventList::linkNotePairsFIFO(MidiEventList *this)

{
  size_t *psVar1;
  uint uVar2;
  MidiEvent *this_00;
  pointer plVar3;
  pointer plVar4;
  MidiEvent *this_01;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *__s;
  pointer ppMVar10;
  _List_node_base *p_Var11;
  vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *noteon;
  vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *this_02;
  long lVar12;
  long lVar13;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  int local_a0;
  allocator_type local_99;
  undefined1 local_98 [16];
  pointer local_88;
  void *local_80;
  undefined1 local_78 [16];
  pointer local_68;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  local_60;
  value_type local_48;
  
  local_78 = (undefined1  [16])0x0;
  local_68 = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
            *)local_78,0x10);
  uVar5 = local_78._8_8_;
  for (this_02 = (vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                  *)local_78._0_8_;
      this_02 !=
      (vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
       *)uVar5; this_02 = this_02 + 1) {
    std::
    vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
    ::resize(this_02,0x80);
  }
  __s = operator_new(0x400);
  memset(__s,0,0x400);
  *(undefined4 *)((long)__s + 0x200) = 1;
  *(undefined8 *)((long)__s + 0x208) = 0x100000001;
  *(undefined8 *)((long)__s + 0x210) = 0x200000001;
  *(undefined8 *)((long)__s + 0x218) = 0x300000001;
  *(undefined8 *)((long)__s + 0x220) = 0x400000001;
  *(undefined8 *)((long)__s + 0x228) = 0x500000001;
  *(undefined8 *)((long)__s + 0x280) = 0x600000001;
  *(undefined8 *)((long)__s + 0x288) = 0x700000001;
  *(undefined8 *)((long)__s + 0x290) = 0x800000001;
  *(undefined8 *)((long)__s + 0x298) = 0x900000001;
  *(undefined8 *)((long)__s + 0x2a0) = 0xa00000001;
  *(undefined8 *)((long)__s + 0x2a8) = 0xb00000001;
  *(undefined8 *)((long)__s + 0x2b0) = 0xc00000001;
  *(undefined8 *)((long)__s + 0x2b8) = 0xd00000001;
  *(undefined8 *)((long)__s + 0x2c0) = 0xe00000001;
  *(undefined8 *)((long)__s + 0x2c8) = 0xf00000001;
  *(undefined8 *)((long)__s + 0x2d0) = 0x1000000001;
  *(undefined8 *)((long)__s + 0x3d0) = 0x1100000001;
  local_98 = (undefined1  [16])0x0;
  local_88 = (pointer)0x0;
  local_80 = __s;
  local_98._0_8_ = operator_new(0x80);
  local_88 = (pointer)(local_98._0_8_ + 0x80);
  *(undefined1 (*) [16])(local_98._0_8_ + 0x70) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x60) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x50) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x40) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_98._0_8_ + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])local_98._0_8_ = (undefined1  [16])0x0;
  local_98._8_8_ = local_88;
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::vector(&local_60,0x12,(value_type *)local_98,(allocator_type *)&local_48);
  if ((pointer)local_98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._0_8_);
  }
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x40);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 0x10;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [0xc] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [0xd] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [0xe] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [0xf] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[8]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[9]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [10] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [0xb] = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[4]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[5]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[6]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[7]
       = -1;
  *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3]
       = -1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_98,0x12,&local_48,&local_99);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppMVar10 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->list).
                          super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar10) >> 3) < 1) {
    local_a0 = 0;
  }
  else {
    lVar12 = 0;
    local_a0 = 0;
    do {
      this_00 = ppMVar10[lVar12];
      MidiEvent::unlinkEvent(this_00);
      bVar6 = MidiMessage::isNoteOn(&this_00->super_MidiMessage);
      if (bVar6) {
        iVar7 = MidiMessage::getKeyNumber(&this_00->super_MidiMessage);
        iVar8 = MidiMessage::getChannel(&this_00->super_MidiMessage);
        plVar3 = (((pointer)(local_78._0_8_ + (long)iVar8 * 0x18))->
                 super__Vector_base<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        p_Var11 = (_List_node_base *)operator_new(0x18);
        p_Var11[1]._M_next = (_List_node_base *)this_00;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = (size_t *)
                 ((long)&plVar3[iVar7].
                         super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                         _M_impl._M_node + 0x10);
        *psVar1 = *psVar1 + 1;
      }
      else {
        bVar6 = MidiMessage::isNoteOff(&this_00->super_MidiMessage);
        if (bVar6) {
          iVar7 = MidiMessage::getKeyNumber(&this_00->super_MidiMessage);
          iVar8 = MidiMessage::getChannel(&this_00->super_MidiMessage);
          plVar3 = (((pointer)(local_78._0_8_ + (long)iVar8 * 0x18))->
                   super__Vector_base<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + iVar7;
          plVar4 = *(pointer *)
                    &(plVar3->super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>)
                     ._M_impl._M_node;
          if (plVar4 != plVar3) {
            this_01 = *(MidiEvent **)
                       ((long)&(plVar4->
                               super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               )._M_impl._M_node + 0x10);
            psVar1 = (size_t *)
                     ((long)&(plVar3->
                             super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>).
                             _M_impl._M_node + 0x10);
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(plVar4);
            MidiEvent::linkEvent(this_01,this_00);
            local_a0 = local_a0 + 1;
          }
        }
        else {
          bVar6 = MidiMessage::isController(&this_00->super_MidiMessage);
          if (bVar6) {
            iVar7 = MidiMessage::getP1(&this_00->super_MidiMessage);
            if (*(int *)((long)local_80 + (long)iVar7 * 8) != 0) {
              iVar7 = *(int *)((long)local_80 + (long)iVar7 * 8 + 4);
              iVar8 = MidiMessage::getChannel(&this_00->super_MidiMessage);
              iVar9 = MidiMessage::getP2(&this_00->super_MidiMessage);
              lVar13 = (long)iVar8;
              uVar2 = *(uint *)((long)&(((MidiEvent *)
                                        (((pointer)(local_98._0_8_ + (long)iVar7 * 0x18))->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data._M_start)->super_MidiMessage).
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar13 * 4);
              if ((iVar9 < 0x40) || (uVar2 != 0xffffffff)) {
                if (uVar2 != 0x3f < iVar9) {
                  if ((0x3f < iVar9) && (uVar2 == 0)) goto LAB_00116991;
                  if ((iVar9 < 0x40) && (uVar2 == 1)) {
                    MidiEvent::linkEvent
                              (local_60.
                               super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar7].
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13],this_00);
                    *(uint *)((long)&(((MidiEvent *)
                                      (((pointer)(local_98._0_8_ + (long)iVar7 * 0x18))->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->super_MidiMessage).
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13 * 4) =
                         (uint)(0x3f < iVar9);
                    local_60.
                    super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = this_00;
                  }
                }
              }
              else {
LAB_00116991:
                local_60.
                super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].
                super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] = this_00;
                *(undefined4 *)
                 ((long)&(((MidiEvent *)
                          (((pointer)(local_98._0_8_ + (long)iVar7 * 0x18))->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start)->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13 * 4) = 1;
              }
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      ppMVar10 = (this->list).
                 super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(this->list).
                                          super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppMVar10) >> 3));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_98);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::~vector(&local_60);
  operator_delete(local_80);
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
             *)local_78);
  return local_a0;
}

Assistant:

int MidiEventList::linkNotePairsFIFO(void) {
	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs (FIFO behavior).
	std::vector<std::vector<std::list<MidiEvent*>>> noteons;
	noteons.resize(16);
	for (auto& noteon : noteons) {
		noteon.resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap(128, {0, 0});
	contmap[64] = {1, 0}; contmap[65] = {1, 1}; contmap[66] = {1, 2}; 
	contmap[67] = {1, 3}; contmap[68] = {1, 4}; contmap[69] = {1, 5};
	contmap[80] = {1, 6}; contmap[81] = {1, 7}; contmap[82] = {1, 8}; 
	contmap[83] = {1, 9}; contmap[84] = {1, 10}; contmap[85] = {1, 11};
	contmap[86] = {1, 12}; contmap[87] = {1, 13}; contmap[88] = {1, 14}; 
	contmap[89] = {1, 15}; contmap[90] = {1, 16}; contmap[122] = {1, 17};

	std::vector<std::vector<MidiEvent*>> contevents(18, std::vector<MidiEvent*>(16, nullptr));
	std::vector<std::vector<int>> oldstates(18, std::vector<int>(16, -1));

	int counter = 0;
	for (int i = 0; i < getSize(); i++) {
		MidiEvent* mev = &getEvent(i);
		mev->unlinkEvent();

		if (mev->isNoteOn()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			noteons[channel][key].push_back(mev);  // Enqueue (FIFO)
		} else if (mev->isNoteOff()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			if (!noteons[channel][key].empty()) {  // **Check before accessing**
				MidiEvent* noteon = noteons[channel][key].front(); // Safely access first event
				noteons[channel][key].pop_front(); // Remove first event (FIFO)
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			int contnum = mev->getP1();
			if (contmap[contnum].first) {
				int conti = contmap[contnum].second;
				int channel = mev->getChannel();
				int contval = mev->getP2();
				int contstate = contval < 64 ? 0 : 1;

				if ((oldstates[conti][channel] == -1) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// Redundant controller state, ignore.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}